

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall
CMU462::StaticScene::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *this_00;
  BVHNode *pBVar1;
  
  this_00 = &(this->super_Aggregate).primitives;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00271e38;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  operator=(this_00,_primitives);
  pBVar1 = build_tree(this,this_00,0,
                      (long)(this->super_Aggregate).primitives.
                            super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_Aggregate).primitives.
                            super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3,max_leaf_size);
  this->root = pBVar1;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
		size_t max_leaf_size) {
		this->primitives = _primitives;

		// TODO (PathTracer):
		// Construct a BVH from the given vector of primitives and maximum leaf
		// size configuration. The starter code build a BVH aggregate with a
		// single leaf node (which is also the root) that encloses all the
		// primitives.

		root = build_tree(this->primitives, 0, primitives.size(), max_leaf_size);
	}